

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_backend_timeout(uv_loop_t *loop)

{
  uv_loop_t *loop_local;
  
  if (loop->stop_flag == 0) {
    if ((loop->active_handles == 0) && ((loop->active_reqs).count == 0)) {
      loop_local._4_4_ = 0;
    }
    else if (loop->idle_handles == (void **)loop->idle_handles[0]) {
      if (loop->pending_queue == (void **)loop->pending_queue[0]) {
        if (loop->closing_handles == (uv_handle_t *)0x0) {
          loop_local._4_4_ = uv__next_timeout(loop);
        }
        else {
          loop_local._4_4_ = 0;
        }
      }
      else {
        loop_local._4_4_ = 0;
      }
    }
    else {
      loop_local._4_4_ = 0;
    }
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_backend_timeout(const uv_loop_t* loop) {
  if (loop->stop_flag != 0)
    return 0;

  if (!uv__has_active_handles(loop) && !uv__has_active_reqs(loop))
    return 0;

  if (!QUEUE_EMPTY(&loop->idle_handles))
    return 0;

  if (!QUEUE_EMPTY(&loop->pending_queue))
    return 0;

  if (loop->closing_handles)
    return 0;

  return uv__next_timeout(loop);
}